

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityReissnerIsothropic::ComputeStress
          (ChElasticityReissnerIsothropic *this,ChVector<double> *n_u,ChVector<double> *n_v,
          ChVector<double> *m_u,ChVector<double> *m_v,ChVector<double> *eps_u,
          ChVector<double> *eps_v,ChVector<double> *kur_u,ChVector<double> *kur_v,double z_inf,
          double z_sup,double angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double *pdVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  
  auVar32._8_56_ = in_register_00001248;
  auVar32._0_8_ = z_sup;
  auVar18._8_8_ = 0x8000000000000000;
  auVar18._0_8_ = 0x8000000000000000;
  auVar18 = vxorpd_avx512vl(auVar32._0_16_,auVar18);
  if ((auVar18._0_8_ != z_inf) || (NAN(auVar18._0_8_) || NAN(z_inf))) {
    dVar15 = this->m_nu;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar15;
    auVar18 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar36,auVar36);
    dVar51 = this->m_E / (dVar15 + 1.0 + dVar15 + 1.0);
    dVar20 = this->m_E / auVar18._0_8_;
    dVar15 = dVar15 * dVar20;
    dVar50 = dVar51 + dVar51;
    dVar13 = (this->m_alpha + this->m_alpha) * dVar51;
    dVar51 = (this->m_beta + this->m_beta) * dVar51;
    dVar16 = z_sup - z_inf;
    dVar14 = (z_sup * z_sup - z_inf * z_inf) * 0.5;
    dVar19 = pow(z_sup,3.0);
    dVar21 = pow(z_inf,3.0);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar15;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar20;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar14;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar16;
    pdVar17 = eps_v->m_data + 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = kur_u->m_data[1];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar15 * kur_v->m_data[0];
    auVar18 = vfmadd231sd_fma(auVar37,auVar54,auVar5);
    dVar19 = (dVar19 - dVar21) * 0.3333333333333333;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = eps_u->m_data[0];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar15 * eps_v->m_data[1];
    auVar5 = vfmadd231sd_fma(auVar24,auVar54,auVar6);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar14 * auVar18._0_8_;
    auVar18 = vfmadd231sd_fma(auVar38,auVar56,auVar5);
    n_u->m_data[0] = auVar18._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar50 * eps_u->m_data[1];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar14 * dVar50 * kur_u->m_data[0];
    auVar18 = vfmadd231sd_fma(auVar39,auVar56,auVar25);
    n_u->m_data[1] = auVar18._0_8_;
    n_u->m_data[2] = dVar16 * dVar13 * eps_u->m_data[2];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar50 * eps_v->m_data[0];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar14 * dVar50 * kur_v->m_data[1];
    auVar18 = vfmadd231sd_fma(auVar40,auVar56,auVar26);
    n_v->m_data[0] = auVar18._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = kur_u->m_data[1];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar20 * kur_v->m_data[0];
    auVar18 = vfmadd231sd_fma(auVar41,auVar52,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = eps_u->m_data[0];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar20 * eps_v->m_data[1];
    auVar5 = vfmadd231sd_fma(auVar27,auVar52,auVar8);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar14 * auVar18._0_8_;
    auVar18 = vfmadd231sd_fma(auVar42,auVar56,auVar5);
    n_v->m_data[1] = auVar18._0_8_;
    n_v->m_data[2] = dVar16 * dVar13 * eps_v->m_data[2];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar50 * eps_u->m_data[1];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar19 * dVar50 * kur_u->m_data[0];
    auVar18 = vfmadd231sd_fma(auVar43,auVar55,auVar28);
    m_u->m_data[0] = auVar18._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = kur_u->m_data[1];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar15 * kur_v->m_data[0];
    auVar18 = vfmadd231sd_fma(auVar44,auVar54,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = eps_u->m_data[0];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar15 * eps_v->m_data[1];
    auVar5 = vfmadd231sd_fma(auVar29,auVar54,auVar10);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar19 * auVar18._0_8_;
    auVar18 = vfmadd231sd_fma(auVar45,auVar55,auVar5);
    m_u->m_data[1] = auVar18._0_8_;
    m_u->m_data[2] = dVar19 * dVar51 * eps_u->m_data[2];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = kur_u->m_data[1];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar20 * kur_v->m_data[0];
    auVar18 = vfmadd231sd_fma(auVar46,auVar52,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = eps_u->m_data[0];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar20 * eps_v->m_data[1];
    auVar5 = vfmadd231sd_fma(auVar30,auVar52,auVar12);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar19 * auVar18._0_8_;
    auVar18 = vfmadd231sd_fma(auVar47,auVar55,auVar5);
    m_v->m_data[0] = auVar18._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar50 * eps_v->m_data[0];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar19 * dVar50 * kur_v->m_data[1];
    auVar18 = vfmadd231sd_fma(auVar48,auVar55,auVar31);
    m_v->m_data[1] = auVar18._0_8_;
  }
  else {
    dVar51 = this->m_nu;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar51;
    dVar15 = z_sup - z_inf;
    pdVar17 = &this->m_beta;
    auVar18 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar33,auVar33);
    dVar50 = this->m_E / (dVar51 + 1.0 + dVar51 + 1.0);
    auVar49._0_8_ = (dVar15 * this->m_E) / auVar18._0_8_;
    auVar49._8_8_ = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = eps_u->m_data[0];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar49._0_8_ * dVar51 * eps_v->m_data[1];
    auVar18 = vfmadd231sd_fma(auVar34,auVar49,auVar1);
    auVar53._0_8_ = (dVar15 * dVar15 * auVar49._0_8_) / 12.0;
    auVar53._8_8_ = 0;
    n_u->m_data[0] = auVar18._0_8_;
    dVar19 = (dVar15 * dVar15 * dVar15 * dVar50) / 12.0;
    n_u->m_data[1] = dVar15 * dVar50 * (eps_u->m_data[1] + eps_u->m_data[1]);
    n_u->m_data[2] = dVar15 * dVar50 * eps_u->m_data[2] * this->m_alpha;
    n_v->m_data[0] = dVar15 * dVar50 * (eps_v->m_data[0] + eps_v->m_data[0]);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = eps_v->m_data[1];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auVar49._0_8_ * eps_u->m_data[0] * this->m_nu;
    auVar18 = vfmadd231sd_fma(auVar35,auVar49,auVar2);
    n_v->m_data[1] = auVar18._0_8_;
    n_v->m_data[2] = dVar15 * dVar50 * eps_v->m_data[2] * this->m_alpha;
    m_u->m_data[0] = dVar19 * (kur_u->m_data[0] + kur_u->m_data[0]);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = kur_u->m_data[1];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auVar53._0_8_ * this->m_nu * kur_v->m_data[0];
    auVar18 = vfmsub231sd_fma(auVar22,auVar53,auVar3);
    m_u->m_data[1] = auVar18._0_8_;
    m_u->m_data[2] = dVar19 * kur_u->m_data[2] * this->m_beta;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = kur_v->m_data[0];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar53._0_8_ * this->m_nu * kur_u->m_data[1];
    auVar18 = vfmsub231sd_fma(auVar23,auVar53,auVar4);
    m_v->m_data[0] = auVar18._0_8_;
    m_v->m_data[1] = dVar19 * (kur_v->m_data[1] + kur_v->m_data[1]);
    dVar51 = kur_v->m_data[2];
  }
  m_v->m_data[2] = dVar19 * dVar51 * *pdVar17;
  return;
}

Assistant:

void ChElasticityReissnerIsothropic::ComputeStress(   ChVector<>& n_u,
                                                      ChVector<>& n_v,
                                                      ChVector<>& m_u,
                                                      ChVector<>& m_v,
                                                      const ChVector<>& eps_u,
                                                      const ChVector<>& eps_v,
                                                      const ChVector<>& kur_u,
                                                      const ChVector<>& kur_v,
                                                      const double z_inf,
                                                      const double z_sup,
                                                      const double angle) {
    if (z_inf == -z_sup) {
        // simplified computation for centered layer
        double h = z_sup - z_inf;
        double G = m_E / (2. * (1. + m_nu));
        double C = m_E * h / (1. - m_nu * m_nu);
        double D = C * h * h / 12.;
        double F = G * h * h * h / 12.;

        n_u.x() = eps_u.x() * C + eps_v.y() * m_nu * C;
        n_u.y() = eps_u.y() * 2 * G * h;
        n_u.z() = eps_u.z() * m_alpha * G * h;
        n_v.x() = eps_v.x() * 2 * G * h;
        n_v.y() = eps_v.y() * C + eps_u.x() * m_nu * C;
        n_v.z() = eps_v.z() * m_alpha * G * h;

        m_u.x() = kur_u.x() * 2 * F;
        m_u.y() = kur_u.y() * D + kur_v.x() * (-m_nu * D);
        m_u.z() = kur_u.z() * m_beta * F;
        m_v.x() = kur_v.x() * D + kur_u.y() * (-m_nu * D);
        m_v.y() = kur_v.y() * 2 * F;
        m_v.z() = kur_v.z() * m_beta * F;
    } else {
        // throw ChException("ComputeStiffnessMatrix not yet implemented for non-centered layers");
        double G = m_E / (2. * (1. + m_nu));
        double Q11 = m_E / (1. - m_nu * m_nu);
        double Q22 = Q11;
        double Q12 = m_nu * Q11;
        double Q33 = 2 * G;
        double Q44 = 2 * G;
        double Qss = m_alpha * 2 * G;
        double Qdd = m_beta * 2 * G;
        double h1 = z_sup - z_inf;
        double h2 = 0.5 * (pow(z_sup, 2) - pow(z_inf, 2));
        double h3 = (1. / 3.) * (pow(z_sup, 3) - pow(z_inf, 3));

        n_u.x() = h1 * (eps_u.x() * Q11 + eps_v.y() * Q12) + h2 * (kur_u.y() * Q11 + kur_v.x() * Q12);
        n_u.y() = h1 * (eps_u.y() * Q33) + h2 * (kur_u.x() * Q33);
        n_u.z() = h1 * (eps_u.z() * Qss);
        n_v.x() = h1 * (eps_v.x() * Q44) + h2 * (kur_v.y() * Q44);
        n_v.y() = h1 * (eps_u.x() * Q12 + eps_v.y() * Q22) + h2 * (kur_u.y() * Q12 + kur_v.x() * Q22);
        n_v.z() = h1 * (eps_v.z() * Qss);

        m_u.x() = h2 * (eps_u.y() * Q33) + h3 * (kur_u.x() * Q33);
        m_u.y() = h2 * (eps_u.x() * Q11 + eps_v.y() * Q12) + h3 * (kur_u.y() * Q11 + kur_v.x() * Q12);
        m_u.z() = h3 * (eps_u.z() * Qdd);
        m_v.x() = h2 * (eps_u.x() * Q12 + eps_v.y() * Q22) + h3 * (kur_u.y() * Q12 + kur_v.x() * Q22);
        m_v.y() = h2 * (eps_v.x() * Q44) + h3 * (kur_v.y() * Q44);
        m_v.z() = h3 * (eps_v.z() * Qdd);
    }
}